

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v8::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  fp value_00;
  fp x;
  appender out;
  float_specs specs_00;
  long lVar2;
  result rVar3;
  type tVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  size_t count;
  char *pcVar8;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  int in_EDI;
  bool bVar9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  decimal_fp<double> dVar10;
  fp fVar11;
  fp value_01;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  fp f;
  gen_digits_handler handler;
  fp cached_pow;
  fp normalized;
  int cached_exp10;
  int min_exp;
  bool use_dragon;
  int exp;
  decimal_fp<double> dec;
  decimal_fp<float> dec_1;
  bool fixed;
  buffer<char> *in_stack_00000178;
  undefined4 in_stack_00000188;
  result result_1;
  char digit_1;
  result result;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  round_direction dir;
  uint64_t divisor;
  int precision_offset;
  uint64_t fractional;
  uint32_t integral;
  fp one;
  undefined4 in_stack_fffffffffffffdb8;
  char value_02;
  undefined2 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  fp *in_stack_fffffffffffffdc0;
  buffer<char> *pbVar12;
  uint64_t in_stack_fffffffffffffdc8;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  undefined1 uVar13;
  int *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  uint64_t in_stack_fffffffffffffde8;
  fp *in_stack_fffffffffffffdf0;
  gen_digits_handler *in_stack_fffffffffffffdf8;
  fp *in_stack_fffffffffffffe00;
  fp local_1f0;
  undefined8 in_stack_fffffffffffffe20;
  float fVar14;
  unsigned_long in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int value_03;
  undefined4 in_stack_fffffffffffffe3c;
  double in_stack_fffffffffffffe68;
  buffer<char> *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  double in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  detail *local_140;
  uint local_138;
  int local_114 [3];
  appender local_108;
  significand_type local_100;
  int local_f8;
  appender local_e8;
  decimal_fp<float> local_dc;
  undefined8 local_d4;
  char local_cb;
  byte local_ca;
  bool local_c9;
  buffer<char> *local_c8;
  int local_bc;
  double local_b8;
  undefined8 local_b0;
  result local_a4;
  char local_9d;
  result local_9c;
  long local_98;
  bool local_89;
  anon_class_16_2_fdf32556 local_88;
  uint32_t local_78;
  round_direction local_74;
  long local_70;
  int local_54;
  ulong local_50;
  bool local_46;
  bool local_45;
  uint32_t local_44;
  fp local_40;
  long *local_30;
  int *local_28;
  long local_20;
  ulong local_18;
  int local_10;
  result local_4;
  
  fVar14 = (float)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  local_b8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_c9 = 0.0 <= local_b8;
  local_c8 = in_RDX;
  local_bc = in_EDI;
  local_b0 = in_RSI;
  ignore_unused<bool,char[18]>(&local_c9,(char (*) [18])"value is negative");
  local_ca = (char)((ulong)local_b0 >> 0x20) == '\x02';
  if (local_b8 <= 0.0) {
    if ((0 < local_bc) && ((bool)local_ca)) {
      pbVar12 = local_c8;
      tVar4 = to_unsigned<int>(local_bc);
      value_02 = (char)((uint)in_stack_fffffffffffffdb8 >> 0x18);
      buffer<char>::try_resize(pbVar12,(ulong)tVar4);
      buffer<char>::data(local_c8);
      fill_n<char,int>((char *)in_stack_fffffffffffffdc0,
                       CONCAT13(in_stack_fffffffffffffdbf,
                                CONCAT12(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdbc)),
                       value_02);
      return -local_bc;
    }
    local_cb = '0';
    buffer<char>::push_back(local_c8,&local_cb);
    return 0;
  }
  if ((local_b0._4_4_ >> 0x13 & 1) != 0) {
    local_d4 = local_b0;
    specs_00._4_4_ = in_stack_fffffffffffffeb0;
    specs_00.precision = in_stack_fffffffffffffeac;
    iVar5 = snprintf_float<double>
                      (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,specs_00,
                       in_stack_fffffffffffffe90);
    return iVar5;
  }
  if (local_bc < 0) {
    if ((local_b0._4_4_ >> 0x12 & 1) != 0) {
      local_dc = dragonbox::to_decimal<float>(fVar14);
      appender::back_insert_iterator(&local_e8,local_c8);
      write<char,_fmt::v8::appender,_unsigned_int,_0>(local_e8,local_dc.significand);
      return local_dc.exponent;
    }
    dVar10 = dragonbox::to_decimal<double>(in_stack_fffffffffffffe68);
    local_100 = dVar10.significand;
    local_f8 = dVar10.exponent;
    appender::back_insert_iterator(&local_108,local_c8);
    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
         in_stack_fffffffffffffe3c;
    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffe38;
    write<char,_fmt::v8::appender,_unsigned_long,_0>(out,in_stack_fffffffffffffe30);
    return local_f8;
  }
  local_114[0] = 0;
  fp::fp<double>(in_stack_fffffffffffffdc0,
                 (double)CONCAT17(in_stack_fffffffffffffdbf,
                                  CONCAT16(in_stack_fffffffffffffdbe,
                                           CONCAT24(in_stack_fffffffffffffdbc,
                                                    in_stack_fffffffffffffdb8))));
  value_01.f = (ulong)local_138;
  value_01._8_8_ = extraout_RDX;
  normalize<0>(local_140,value_01);
  get_cached_power(in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
  x._8_6_ = in_stack_fffffffffffffdd0;
  x.f = in_stack_fffffffffffffdc8;
  x._14_1_ = in_stack_fffffffffffffdd6;
  x._15_1_ = in_stack_fffffffffffffdd7;
  fVar11.f._4_2_ = in_stack_fffffffffffffdbc;
  fVar11.f._0_4_ = in_stack_fffffffffffffdb8;
  fVar11.f._6_1_ = in_stack_fffffffffffffdbe;
  fVar11.f._7_1_ = in_stack_fffffffffffffdbf;
  fVar11._8_8_ = in_stack_fffffffffffffdc0;
  fVar11 = operator*(x,fVar11);
  buffer<char>::data(local_c8);
  value_03 = 0;
  local_20 = 1;
  local_28 = local_114;
  local_30 = (long *)&stack0xfffffffffffffe30;
  iVar5 = local_bc;
  local_18 = fVar11.f;
  local_10 = fVar11.e;
  fp::fp(&local_40,1L << (-(char)fVar11.e & 0x3fU),fVar11.e);
  local_44 = (uint32_t)(local_18 >> (-(char)local_40.e & 0x3fU));
  local_45 = local_44 != 0;
  ignore_unused<bool,char[1]>(&local_45,(char (*) [1])0x305f8b);
  local_46 = (ulong)local_44 == local_18 >> (-(char)local_40.e & 0x3fU);
  ignore_unused<bool,char[1]>(&local_46,(char (*) [1])0x305f8b);
  local_50 = local_18 & local_40.f - 1;
  iVar6 = count_digits(local_44);
  *local_28 = iVar6;
  rVar3 = local_9c;
  if ((*(byte *)((long)local_30 + 0x14) & 1) != 0) {
    local_54 = *local_28 + (int)local_30[2];
    if (0 < local_54) {
      in_stack_fffffffffffffde4 = *(int *)((long)local_30 + 0xc);
      iVar6 = max_value<int>();
      if (iVar6 - local_54 < in_stack_fffffffffffffde4) {
        uVar7 = __cxa_allocate_exception(0x10);
        format_error::format_error
                  ((format_error *)in_stack_fffffffffffffdc0,
                   (char *)CONCAT17(in_stack_fffffffffffffdbf,
                                    CONCAT16(in_stack_fffffffffffffdbe,
                                             CONCAT24(in_stack_fffffffffffffdbc,
                                                      in_stack_fffffffffffffdb8))));
        __cxa_throw(uVar7,&format_error::typeinfo,format_error::~format_error);
      }
    }
    *(int *)((long)local_30 + 0xc) = local_54 + *(int *)((long)local_30 + 0xc);
    rVar3 = local_9c;
    if (*(int *)((long)local_30 + 0xc) < 1) {
      if (*(int *)((long)local_30 + 0xc) < 0) {
        local_4 = done;
      }
      else {
        local_70 = basic_impl_data<void>::power_of_10_64[*local_28 + -1] <<
                   (-(char)local_40.e & 0x3fU);
        local_74 = get_round_direction(in_stack_fffffffffffffdc8,(uint64_t)in_stack_fffffffffffffdc0
                                       ,CONCAT17(in_stack_fffffffffffffdbf,
                                                 CONCAT16(in_stack_fffffffffffffdbe,
                                                          CONCAT24(in_stack_fffffffffffffdbc,
                                                                   in_stack_fffffffffffffdb8))));
        if (local_74 == unknown) {
          local_4 = error;
        }
        else {
          uVar13 = 0x31;
          if (local_74 != up) {
            uVar13 = 0x30;
          }
          lVar1 = *local_30;
          lVar2 = local_30[1];
          *(int *)(local_30 + 1) = (int)lVar2 + 1;
          *(undefined1 *)(lVar1 + (int)lVar2) = uVar13;
          local_4 = done;
        }
      }
      goto LAB_002fde7c;
    }
  }
  do {
    local_9c = rVar3;
    local_78 = 0;
    local_88.digit = &local_78;
    local_88.integral = &local_44;
    switch(*local_28) {
    case 1:
      local_78 = local_44;
      local_44 = 0;
      break;
    case 2:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,10);
      break;
    case 3:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,100);
      break;
    case 4:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,1000);
      break;
    case 5:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,10000);
      break;
    case 6:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,100000);
      break;
    case 7:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,1000000);
      break;
    case 8:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,10000000);
      break;
    case 9:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,100000000);
      break;
    case 10:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_88,1000000000);
      break;
    default:
      local_89 = false;
      ignore_unused<bool,char[25]>(&local_89,(char (*) [25])"invalid number of digits");
    }
    *local_28 = *local_28 + -1;
    local_98 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
    local_9c = gen_digits_handler::on_digit
                         (in_stack_fffffffffffffdf8,(char)((ulong)in_stack_fffffffffffffdf0 >> 0x38)
                          ,in_stack_fffffffffffffde8,
                          CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          (uint64_t)in_stack_fffffffffffffdd8,(bool)in_stack_fffffffffffffdd7);
    local_4 = local_9c;
    if (local_9c != more) goto LAB_002fde7c;
    rVar3 = more;
  } while (0 < *local_28);
  while( true ) {
    local_20 = local_20 * 10;
    local_9d = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
    local_50 = local_40.f - 1 & local_50 * 10;
    *local_28 = *local_28 + -1;
    local_a4 = gen_digits_handler::on_digit
                         (in_stack_fffffffffffffdf8,(char)((ulong)in_stack_fffffffffffffdf0 >> 0x38)
                          ,in_stack_fffffffffffffde8,
                          CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          (uint64_t)in_stack_fffffffffffffdd8,(bool)in_stack_fffffffffffffdd7);
    local_4 = local_a4;
    if (local_a4 != more) break;
    local_a4 = more;
  }
LAB_002fde7c:
  fVar14 = (float)(in_stack_fffffffffffffde8 >> 0x20);
  bVar9 = local_4 == error;
  if (bVar9) {
    local_114[0] = value_03 + -1 + local_114[0];
    local_bc = iVar5;
  }
  else {
    pbVar12 = local_c8;
    tVar4 = to_unsigned<int>(value_03);
    buffer<char>::try_resize(pbVar12,(ulong)tVar4);
  }
  if (bVar9) {
    fp::fp(&local_1f0);
    if ((local_b0._4_4_ >> 0x12 & 1) == 0) {
      fp::assign<double,_0>(in_stack_fffffffffffffe00,(double)in_stack_fffffffffffffdf8);
    }
    else {
      fp::assign<float,_0>(in_stack_fffffffffffffdf0,fVar14);
    }
    if (0x2ff < local_bc) {
      local_bc = 0x2ff;
    }
    value_00.f._4_4_ = precision;
    value_00.f._0_4_ = in_stack_00000188;
    value_00._8_8_ = value;
    format_dragon(value_00,buf._7_1_,(int)buf,in_stack_00000178,stack0x00000170);
  }
  if (((local_ca & 1) == 0) && ((local_b0._4_4_ >> 0x14 & 1) == 0)) {
    count = buffer<char>::size(local_c8);
    while( true ) {
      bVar9 = false;
      if (count != 0) {
        pcVar8 = buffer<char>::operator[]<unsigned_long>(local_c8,count - 1);
        bVar9 = *pcVar8 == '0';
      }
      if (!bVar9) break;
      count = count - 1;
      local_114[0] = local_114[0] + 1;
    }
    buffer<char>::try_resize(local_c8,count);
  }
  return local_114[0];
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}